

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O3

void __thiscall
Am_Load_Save_Context::Register_Prototype(Am_Load_Save_Context *this,char *name,Am_Wrapper *value)

{
  uint *puVar1;
  Am_Map_Names *this_00;
  Am_Map_Prototypes *this_01;
  int iVar2;
  uint uVar3;
  Am_Load_Save_Context_Data *this_02;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  key_type local_38;
  key_type local_30;
  
  this_02 = this->data;
  if (this_02 == (Am_Load_Save_Context_Data *)0x0) {
    this_02 = (Am_Load_Save_Context_Data *)operator_new(0x48);
    Am_Load_Save_Context_Data::Am_Load_Save_Context_Data(this_02);
    this->data = this_02;
  }
  iVar2 = (*(this_02->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])
                    (this_02);
  this->data = (Am_Load_Save_Context_Data *)CONCAT44(extraout_var,iVar2);
  this_00 = ((Am_Load_Save_Context_Data *)CONCAT44(extraout_var,iVar2))->names;
  if (value != (Am_Wrapper *)0x0) {
    value->refs = value->refs + 1;
  }
  local_38.data = value;
  pmVar4 = std::
           map<Wrapper_Holder,_Name_Num,_std::less<Wrapper_Holder>,_std::allocator<std::pair<const_Wrapper_Holder,_Name_Num>_>_>
           ::operator[](&this_00->mMap,&local_38);
  pmVar4->name = name;
  pmVar4->number = -1;
  if (local_38.data != (Am_Wrapper *)0x0) {
    puVar1 = &(local_38.data)->refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*((local_38.data)->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])();
    }
  }
  this_01 = this->data->prototypes;
  local_30.number = -1;
  if (value != (Am_Wrapper *)0x0) {
    value->refs = value->refs + 1;
  }
  local_30.name = name;
  pmVar5 = std::
           map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>,_std::allocator<std::pair<const_Name_Num,_Wrapper_Holder>_>_>
           ::operator[](&this_01->mMap,&local_30);
  pmVar5->data = value;
  if (value != (Am_Wrapper *)0x0) {
    uVar3 = value->refs;
    if (uVar3 == 0) {
      (*(value->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])(value);
      uVar3 = value->refs;
    }
    value->refs = uVar3 - 1;
    if (uVar3 - 1 == 0) {
      (*(value->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])(value);
    }
  }
  return;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}